

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_Shutdown(void)

{
  ImGui_ImplSDL2_Data *p;
  ImGuiIO *pIVar1;
  long lVar2;
  
  p = ImGui_ImplSDL2_GetBackendData();
  pIVar1 = ImGui::GetIO();
  if (p->ClipboardTextData != (char *)0x0) {
    SDL_free();
  }
  for (lVar2 = 5; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    SDL_FreeCursor(p->MouseCursors[lVar2 + -5]);
  }
  ImGui_ImplSDL2_CloseGamepads();
  pIVar1->BackendPlatformName = (char *)0x0;
  pIVar1->BackendPlatformUserData = (void *)0x0;
  *(byte *)&pIVar1->BackendFlags = (byte)pIVar1->BackendFlags & 0xf8;
  IM_DELETE<ImGui_ImplSDL2_Data>(p);
  return;
}

Assistant:

void ImGui_ImplSDL2_Shutdown()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "No platform backend to shutdown, or already shutdown?");
    ImGuiIO& io = ImGui::GetIO();

    if (bd->ClipboardTextData)
        SDL_free(bd->ClipboardTextData);
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        SDL_FreeCursor(bd->MouseCursors[cursor_n]);
    ImGui_ImplSDL2_CloseGamepads();

    io.BackendPlatformName = nullptr;
    io.BackendPlatformUserData = nullptr;
    io.BackendFlags &= ~(ImGuiBackendFlags_HasMouseCursors | ImGuiBackendFlags_HasSetMousePos | ImGuiBackendFlags_HasGamepad);
    IM_DELETE(bd);
}